

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connecter.cpp
# Opt level: O0

void __thiscall
zmq::tcp_connecter_t::tcp_connecter_t
          (tcp_connecter_t *this,io_thread_t *io_thread_,session_base_t *session_,
          options_t *options_,address_t *addr_,bool delayed_start_)

{
  bool bVar1;
  address_t *in_RCX;
  options_t *in_RDX;
  session_base_t *in_RSI;
  io_thread_t *in_RDI;
  undefined8 in_R8;
  stream_connecter_base_t *unaff_retaddr;
  char *in_stack_ffffffffffffffa8;
  undefined8 *puVar2;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  
  stream_connecter_base_t::stream_connecter_base_t
            (unaff_retaddr,in_RDI,in_RSI,in_RDX,in_RCX,SUB81((ulong)in_R8 >> 0x38,0));
  (in_RDI->super_object_t)._vptr_object_t = (_func_int **)&PTR__tcp_connecter_t_003ea7d0;
  in_RDI[6]._mailbox._cpipe.super_ypipe_base_t<zmq::command_t>._vptr_ypipe_base_t =
       (_func_int **)&DAT_003ea8c8;
  *(undefined1 *)&in_RDI[6]._mailbox._signaler._w = 0;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    puVar2 = (undefined8 *)&stderr;
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_addr->protocol == protocol_name::tcp",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_connecter.cpp"
            ,0x4a);
    fflush((FILE *)*puVar2);
    zmq_abort((char *)0x30b576);
  }
  return;
}

Assistant:

zmq::tcp_connecter_t::tcp_connecter_t (class io_thread_t *io_thread_,
                                       class session_base_t *session_,
                                       const options_t &options_,
                                       address_t *addr_,
                                       bool delayed_start_) :
    stream_connecter_base_t (
      io_thread_, session_, options_, addr_, delayed_start_),
    _connect_timer_started (false)
{
    zmq_assert (_addr->protocol == protocol_name::tcp);
}